

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O3

void aom_highbd_lpf_vertical_8_dual_sse2
               (uint16_t *s,int p,uint8_t *blimit0,uint8_t *limit0,uint8_t *thresh0,uint8_t *blimit1
               ,uint8_t *limit1,uint8_t *thresh1,int bd)

{
  uint16_t *puVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  uint16_t uVar49;
  uint16_t uVar50;
  uint16_t uVar51;
  uint16_t uVar52;
  uint16_t uVar53;
  uint16_t uVar54;
  uint16_t uVar55;
  uint16_t uVar56;
  uint16_t uVar57;
  uint16_t uVar58;
  uint16_t uVar59;
  uint16_t uVar60;
  uint16_t uVar61;
  uint16_t uVar62;
  uint16_t uVar63;
  uint16_t uVar64;
  uint16_t uVar65;
  uint16_t uVar66;
  uint16_t uVar67;
  uint16_t uVar68;
  uint16_t uVar69;
  uint16_t uVar70;
  uint16_t uVar71;
  uint16_t uVar72;
  uint16_t uVar73;
  uint16_t uVar74;
  uint16_t uVar75;
  uint16_t uVar76;
  uint16_t uVar77;
  uint16_t uVar78;
  uint16_t uVar79;
  uint16_t uVar80;
  undefined1 auVar81 [12];
  undefined1 auVar82 [12];
  undefined1 auVar83 [12];
  undefined1 auVar84 [12];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [12];
  undefined1 auVar92 [12];
  undefined1 auVar93 [12];
  undefined1 auVar94 [12];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  long lVar107;
  long lVar108;
  ushort uVar109;
  ushort uVar118;
  ushort uVar119;
  ushort uVar120;
  ushort uVar122;
  undefined1 auVar110 [12];
  short sVar125;
  short sVar127;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  ushort uVar124;
  ushort uVar126;
  ushort uVar128;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  short sVar131;
  short sVar135;
  short sVar136;
  short sVar137;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  short sVar138;
  undefined4 uVar139;
  short sVar149;
  short sVar150;
  short sVar152;
  undefined1 auVar140 [12];
  short sVar155;
  short sVar157;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  short sVar148;
  short sVar154;
  short sVar156;
  short sVar158;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  ushort uVar159;
  ushort uVar169;
  ushort uVar170;
  ushort uVar171;
  ushort uVar173;
  undefined1 auVar160 [12];
  short sVar176;
  short sVar178;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  ushort uVar175;
  ushort uVar177;
  ushort uVar179;
  undefined1 auVar164 [16];
  undefined1 auVar168 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  short sVar193;
  short sVar194;
  short sVar195;
  short sVar196;
  short sVar198;
  short sVar199;
  short sVar200;
  short sVar201;
  short sVar202;
  short sVar203;
  short sVar204;
  short sVar205;
  short sVar206;
  short sVar207;
  short sVar208;
  short sVar209;
  short sVar210;
  short sVar211;
  short sVar212;
  short sVar213;
  short sVar214;
  short sVar215;
  short sVar216;
  short sVar217;
  short sVar218;
  short sVar219;
  short sVar220;
  short sVar221;
  undefined1 auVar197 [16];
  short sVar222;
  short sVar223;
  short sVar224;
  short sVar225;
  short sVar226;
  short sVar232;
  short sVar233;
  short sVar234;
  undefined1 auVar227 [12];
  short sVar235;
  short sVar244;
  short sVar245;
  short sVar246;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  short sVar247;
  undefined4 uVar248;
  short sVar259;
  short sVar260;
  short sVar261;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined4 uVar262;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  ushort uVar269;
  ushort uVar274;
  ushort uVar275;
  ushort uVar276;
  ushort uVar278;
  undefined1 auVar270 [12];
  short sVar281;
  short sVar283;
  undefined1 auVar272 [16];
  ushort uVar280;
  ushort uVar282;
  ushort uVar284;
  undefined1 auVar273 [16];
  undefined4 uVar285;
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined8 uVar291;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  ushort uVar295;
  ushort uVar299;
  ushort uVar300;
  ushort uVar301;
  ushort uVar302;
  ushort uVar303;
  ushort uVar304;
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  ushort uVar305;
  undefined1 auVar298 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  short sVar121;
  short sVar123;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  short sVar151;
  short sVar153;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  short sVar172;
  short sVar174;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar250 [16];
  undefined1 auVar249 [12];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar258 [16];
  undefined1 auVar263 [12];
  undefined1 auVar268 [16];
  undefined1 auVar271 [16];
  short sVar277;
  short sVar279;
  undefined1 auVar286 [12];
  undefined1 auVar290 [16];
  undefined1 auVar292 [16];
  
  auVar111 = *(undefined1 (*) [16])(s + -4);
  puVar1 = s + (long)p + -4;
  uVar49 = *puVar1;
  uVar50 = puVar1[1];
  uVar51 = puVar1[2];
  uVar52 = puVar1[3];
  uVar53 = puVar1[4];
  uVar54 = puVar1[5];
  uVar55 = puVar1[6];
  uVar56 = puVar1[7];
  auVar112 = *(undefined1 (*) [16])(s + (long)(p * 2) + -4);
  lVar107 = (long)(p * 3);
  puVar1 = s + lVar107 + -4;
  uVar57 = *puVar1;
  uVar58 = puVar1[1];
  uVar59 = puVar1[2];
  uVar60 = puVar1[3];
  uVar61 = puVar1[4];
  uVar62 = puVar1[5];
  uVar63 = puVar1[6];
  uVar64 = puVar1[7];
  auVar142 = *(undefined1 (*) [16])(s + (long)(p * 4) + -4);
  puVar1 = s + (long)(p * 5) + -4;
  uVar65 = *puVar1;
  uVar66 = puVar1[1];
  uVar67 = puVar1[2];
  uVar68 = puVar1[3];
  uVar69 = puVar1[4];
  uVar70 = puVar1[5];
  uVar71 = puVar1[6];
  uVar72 = puVar1[7];
  auVar161 = *(undefined1 (*) [16])(s + (long)(p * 6) + -4);
  lVar108 = (long)(p * 7);
  puVar1 = s + lVar108 + -4;
  uVar73 = *puVar1;
  uVar74 = puVar1[1];
  uVar75 = puVar1[2];
  uVar76 = puVar1[3];
  uVar77 = puVar1[4];
  uVar78 = puVar1[5];
  uVar79 = puVar1[6];
  uVar80 = puVar1[7];
  sVar137 = auVar111._6_2_;
  auVar143._0_12_ = auVar111._0_12_;
  auVar143._12_2_ = sVar137;
  auVar143._14_2_ = uVar52;
  auVar266._12_4_ = auVar143._12_4_;
  auVar266._0_10_ = auVar111._0_10_;
  auVar266._10_2_ = uVar51;
  sVar136 = auVar111._4_2_;
  auVar288._10_6_ = auVar266._10_6_;
  auVar288._0_8_ = auVar111._0_8_;
  auVar288._8_2_ = sVar136;
  auVar81._4_8_ = auVar288._8_8_;
  auVar81._2_2_ = uVar50;
  sVar135 = auVar111._2_2_;
  auVar81._0_2_ = sVar135;
  sVar131 = auVar111._0_2_;
  auVar272._0_4_ = CONCAT22(uVar49,sVar131);
  auVar272._4_12_ = auVar81;
  sVar234 = auVar112._6_2_;
  auVar230._0_12_ = auVar112._0_12_;
  auVar230._12_2_ = sVar234;
  auVar230._14_2_ = uVar60;
  auVar229._12_4_ = auVar230._12_4_;
  auVar229._0_10_ = auVar112._0_10_;
  auVar229._10_2_ = uVar59;
  sVar233 = auVar112._4_2_;
  auVar228._10_6_ = auVar229._10_6_;
  auVar228._0_8_ = auVar112._0_8_;
  auVar228._8_2_ = sVar233;
  auVar82._4_8_ = auVar228._8_8_;
  auVar82._2_2_ = uVar58;
  sVar232 = auVar112._2_2_;
  auVar82._0_2_ = sVar232;
  sVar226 = auVar112._0_2_;
  sVar246 = auVar142._6_2_;
  auVar239._0_12_ = auVar142._0_12_;
  auVar239._12_2_ = sVar246;
  auVar239._14_2_ = uVar68;
  auVar238._12_4_ = auVar239._12_4_;
  auVar238._0_10_ = auVar142._0_10_;
  auVar238._10_2_ = uVar67;
  sVar245 = auVar142._4_2_;
  auVar237._10_6_ = auVar238._10_6_;
  auVar237._0_8_ = auVar142._0_8_;
  auVar237._8_2_ = sVar245;
  auVar83._4_8_ = auVar237._8_8_;
  auVar83._2_2_ = uVar66;
  sVar244 = auVar142._2_2_;
  auVar83._0_2_ = sVar244;
  sVar235 = auVar142._0_2_;
  auVar236._0_4_ = CONCAT22(uVar65,sVar235);
  auVar236._4_12_ = auVar83;
  sVar261 = auVar161._6_2_;
  auVar252._0_12_ = auVar161._0_12_;
  auVar252._12_2_ = sVar261;
  auVar252._14_2_ = uVar76;
  auVar251._12_4_ = auVar252._12_4_;
  auVar251._0_10_ = auVar161._0_10_;
  auVar251._10_2_ = uVar75;
  sVar260 = auVar161._4_2_;
  auVar250._10_6_ = auVar251._10_6_;
  auVar250._0_8_ = auVar161._0_8_;
  auVar250._8_2_ = sVar260;
  auVar84._4_8_ = auVar250._8_8_;
  auVar84._2_2_ = uVar74;
  sVar259 = auVar161._2_2_;
  auVar84._0_2_ = sVar259;
  sVar247 = auVar161._0_2_;
  auVar287._14_2_ = uVar73;
  auVar287._12_2_ = sVar247;
  auVar292._0_8_ = auVar272._0_8_;
  auVar292._8_4_ = auVar81._0_4_;
  auVar292._12_4_ = auVar82._0_4_;
  uVar291 = CONCAT44(CONCAT22(uVar57,sVar226),auVar272._0_4_);
  auVar264._0_8_ = auVar236._0_8_;
  auVar264._8_4_ = auVar83._0_4_;
  auVar264._12_4_ = auVar84._0_4_;
  auVar287._8_4_ = auVar236._0_4_;
  auVar287._0_8_ = uVar291;
  auVar243._8_8_ = auVar264._8_8_;
  auVar243._0_8_ = auVar292._8_8_;
  auVar132._0_8_ = CONCAT44(auVar228._8_4_,auVar288._8_4_);
  auVar132._8_4_ = auVar266._12_4_;
  auVar132._12_4_ = auVar229._12_4_;
  auVar240._0_8_ = CONCAT44(auVar250._8_4_,auVar237._8_4_);
  auVar240._8_4_ = auVar238._12_4_;
  auVar240._12_4_ = auVar251._12_4_;
  auVar296._8_8_ = auVar240._0_8_;
  auVar296._0_8_ = auVar132._0_8_;
  auVar133._8_8_ = auVar240._8_8_;
  auVar133._0_8_ = auVar132._8_8_;
  sVar277 = auVar111._8_2_;
  sVar279 = auVar111._10_2_;
  auVar270._0_8_ = CONCAT26(uVar54,CONCAT24(sVar279,CONCAT22(uVar53,sVar277)));
  sVar281 = auVar111._12_2_;
  auVar270._8_2_ = sVar281;
  auVar270._10_2_ = uVar55;
  sVar283 = auVar111._14_2_;
  auVar271._12_2_ = sVar283;
  auVar271._0_12_ = auVar270;
  auVar271._14_2_ = uVar56;
  sVar151 = auVar112._8_2_;
  sVar153 = auVar112._10_2_;
  auVar140._0_8_ = CONCAT26(uVar62,CONCAT24(sVar153,CONCAT22(uVar61,sVar151)));
  sVar155 = auVar112._12_2_;
  auVar140._8_2_ = sVar155;
  auVar140._10_2_ = uVar63;
  sVar157 = auVar112._14_2_;
  sVar121 = auVar142._8_2_;
  sVar123 = auVar142._10_2_;
  auVar110._0_8_ = CONCAT26(uVar70,CONCAT24(sVar123,CONCAT22(uVar69,sVar121)));
  sVar125 = auVar142._12_2_;
  auVar110._8_2_ = sVar125;
  auVar110._10_2_ = uVar71;
  sVar127 = auVar142._14_2_;
  sVar172 = auVar161._8_2_;
  sVar174 = auVar161._10_2_;
  auVar160._0_8_ = CONCAT26(uVar78,CONCAT24(sVar174,CONCAT22(uVar77,sVar172)));
  sVar176 = auVar161._12_2_;
  auVar160._8_2_ = sVar176;
  auVar160._10_2_ = uVar79;
  sVar178 = auVar161._14_2_;
  auVar241._8_4_ = (int)((ulong)auVar270._0_8_ >> 0x20);
  auVar241._0_8_ = auVar270._0_8_;
  auVar241._12_4_ = (int)((ulong)auVar140._0_8_ >> 0x20);
  auVar197._4_4_ = CONCAT22(uVar61,sVar151);
  auVar197._0_4_ = CONCAT22(uVar53,sVar277);
  auVar180._8_4_ = (int)((ulong)auVar110._0_8_ >> 0x20);
  auVar180._0_8_ = auVar110._0_8_;
  auVar180._12_4_ = (int)((ulong)auVar160._0_8_ >> 0x20);
  auVar197._12_4_ = CONCAT22(uVar77,sVar172);
  auVar197._8_4_ = CONCAT22(uVar69,sVar121);
  auVar242._8_8_ = auVar180._8_8_;
  auVar242._0_8_ = auVar241._8_8_;
  auVar289._4_4_ = auVar140._8_4_;
  auVar289._0_4_ = auVar270._8_4_;
  auVar289._12_4_ = auVar160._8_4_;
  auVar289._8_4_ = auVar110._8_4_;
  auVar111 = *(undefined1 (*) [16])blimit0;
  auVar112 = *(undefined1 (*) [16])blimit1;
  auVar2[0xd] = 0;
  auVar2._0_13_ = auVar111._0_13_;
  auVar2[0xe] = auVar111[7];
  auVar8[0xc] = auVar111[6];
  auVar8._0_12_ = auVar111._0_12_;
  auVar8._13_2_ = auVar2._13_2_;
  auVar14[0xb] = 0;
  auVar14._0_11_ = auVar111._0_11_;
  auVar14._12_3_ = auVar8._12_3_;
  auVar20[10] = auVar111[5];
  auVar20._0_10_ = auVar111._0_10_;
  auVar20._11_4_ = auVar14._11_4_;
  auVar26[9] = 0;
  auVar26._0_9_ = auVar111._0_9_;
  auVar26._10_5_ = auVar20._10_5_;
  auVar32[8] = auVar111[4];
  auVar32._0_8_ = auVar111._0_8_;
  auVar32._9_6_ = auVar26._9_6_;
  auVar85._7_8_ = 0;
  auVar85._0_7_ = auVar32._8_7_;
  auVar95._1_8_ = SUB158(auVar85 << 0x40,7);
  auVar95[0] = auVar111[3];
  auVar95._9_6_ = 0;
  auVar96._1_10_ = SUB1510(auVar95 << 0x30,5);
  auVar96[0] = auVar111[2];
  auVar96._11_4_ = 0;
  auVar38[2] = auVar111[1];
  auVar38._0_2_ = auVar111._0_2_;
  auVar38._3_12_ = SUB1512(auVar96 << 0x20,3);
  auVar43._2_13_ = auVar38._2_13_;
  auVar43._0_2_ = auVar111._0_2_ & 0xff;
  auVar3[0xd] = 0;
  auVar3._0_13_ = auVar112._0_13_;
  auVar3[0xe] = auVar112[7];
  auVar9[0xc] = auVar112[6];
  auVar9._0_12_ = auVar112._0_12_;
  auVar9._13_2_ = auVar3._13_2_;
  auVar15[0xb] = 0;
  auVar15._0_11_ = auVar112._0_11_;
  auVar15._12_3_ = auVar9._12_3_;
  auVar21[10] = auVar112[5];
  auVar21._0_10_ = auVar112._0_10_;
  auVar21._11_4_ = auVar15._11_4_;
  auVar27[9] = 0;
  auVar27._0_9_ = auVar112._0_9_;
  auVar27._10_5_ = auVar21._10_5_;
  auVar33[8] = auVar112[4];
  auVar33._0_8_ = auVar112._0_8_;
  auVar33._9_6_ = auVar27._9_6_;
  auVar86._7_8_ = 0;
  auVar86._0_7_ = auVar33._8_7_;
  auVar97._1_8_ = SUB158(auVar86 << 0x40,7);
  auVar97[0] = auVar112[3];
  auVar97._9_6_ = 0;
  auVar98._1_10_ = SUB1510(auVar97 << 0x30,5);
  auVar98[0] = auVar112[2];
  auVar98._11_4_ = 0;
  auVar39[2] = auVar112[1];
  auVar39._0_2_ = auVar112._0_2_;
  auVar39._3_12_ = SUB1512(auVar98 << 0x20,3);
  auVar44._2_13_ = auVar39._2_13_;
  auVar44._0_2_ = auVar112._0_2_ & 0xff;
  auVar253._0_8_ = auVar43._0_8_;
  auVar253._8_8_ = auVar44._0_8_;
  auVar141 = ZEXT416(bd - 8);
  auVar254 = psllw(auVar253,auVar141);
  auVar111 = *(undefined1 (*) [16])limit0;
  auVar4[0xd] = 0;
  auVar4._0_13_ = auVar111._0_13_;
  auVar4[0xe] = auVar111[7];
  auVar10[0xc] = auVar111[6];
  auVar10._0_12_ = auVar111._0_12_;
  auVar10._13_2_ = auVar4._13_2_;
  auVar16[0xb] = 0;
  auVar16._0_11_ = auVar111._0_11_;
  auVar16._12_3_ = auVar10._12_3_;
  auVar22[10] = auVar111[5];
  auVar22._0_10_ = auVar111._0_10_;
  auVar22._11_4_ = auVar16._11_4_;
  auVar28[9] = 0;
  auVar28._0_9_ = auVar111._0_9_;
  auVar28._10_5_ = auVar22._10_5_;
  auVar34[8] = auVar111[4];
  auVar34._0_8_ = auVar111._0_8_;
  auVar34._9_6_ = auVar28._9_6_;
  auVar87._7_8_ = 0;
  auVar87._0_7_ = auVar34._8_7_;
  auVar99._1_8_ = SUB158(auVar87 << 0x40,7);
  auVar99[0] = auVar111[3];
  auVar99._9_6_ = 0;
  auVar100._1_10_ = SUB1510(auVar99 << 0x30,5);
  auVar100[0] = auVar111[2];
  auVar100._11_4_ = 0;
  auVar45._3_12_ = SUB1512(auVar100 << 0x20,3);
  auVar45[2] = auVar111[1];
  auVar45[1] = 0;
  auVar45[0] = auVar111[0];
  auVar111 = *(undefined1 (*) [16])limit1;
  auVar5[0xd] = 0;
  auVar5._0_13_ = auVar111._0_13_;
  auVar5[0xe] = auVar111[7];
  auVar11[0xc] = auVar111[6];
  auVar11._0_12_ = auVar111._0_12_;
  auVar11._13_2_ = auVar5._13_2_;
  auVar17[0xb] = 0;
  auVar17._0_11_ = auVar111._0_11_;
  auVar17._12_3_ = auVar11._12_3_;
  auVar23[10] = auVar111[5];
  auVar23._0_10_ = auVar111._0_10_;
  auVar23._11_4_ = auVar17._11_4_;
  auVar29[9] = 0;
  auVar29._0_9_ = auVar111._0_9_;
  auVar29._10_5_ = auVar23._10_5_;
  auVar35[8] = auVar111[4];
  auVar35._0_8_ = auVar111._0_8_;
  auVar35._9_6_ = auVar29._9_6_;
  auVar88._7_8_ = 0;
  auVar88._0_7_ = auVar35._8_7_;
  auVar101._1_8_ = SUB158(auVar88 << 0x40,7);
  auVar101[0] = auVar111[3];
  auVar101._9_6_ = 0;
  auVar102._1_10_ = SUB1510(auVar101 << 0x30,5);
  auVar102[0] = auVar111[2];
  auVar102._11_4_ = 0;
  auVar40[2] = auVar111[1];
  auVar40._0_2_ = auVar111._0_2_;
  auVar40._3_12_ = SUB1512(auVar102 << 0x20,3);
  auVar46._2_13_ = auVar40._2_13_;
  auVar46._0_2_ = auVar111._0_2_ & 0xff;
  auVar186._0_8_ = auVar45._0_8_;
  auVar186._8_8_ = auVar46._0_8_;
  auVar187 = psllw(auVar186,auVar141);
  auVar111 = *(undefined1 (*) [16])thresh0;
  auVar6[0xd] = 0;
  auVar6._0_13_ = auVar111._0_13_;
  auVar6[0xe] = auVar111[7];
  auVar12[0xc] = auVar111[6];
  auVar12._0_12_ = auVar111._0_12_;
  auVar12._13_2_ = auVar6._13_2_;
  auVar18[0xb] = 0;
  auVar18._0_11_ = auVar111._0_11_;
  auVar18._12_3_ = auVar12._12_3_;
  auVar24[10] = auVar111[5];
  auVar24._0_10_ = auVar111._0_10_;
  auVar24._11_4_ = auVar18._11_4_;
  auVar30[9] = 0;
  auVar30._0_9_ = auVar111._0_9_;
  auVar30._10_5_ = auVar24._10_5_;
  auVar36[8] = auVar111[4];
  auVar36._0_8_ = auVar111._0_8_;
  auVar36._9_6_ = auVar30._9_6_;
  auVar89._7_8_ = 0;
  auVar89._0_7_ = auVar36._8_7_;
  auVar103._1_8_ = SUB158(auVar89 << 0x40,7);
  auVar103[0] = auVar111[3];
  auVar103._9_6_ = 0;
  auVar104._1_10_ = SUB1510(auVar103 << 0x30,5);
  auVar104[0] = auVar111[2];
  auVar104._11_4_ = 0;
  auVar41[2] = auVar111[1];
  auVar41._0_2_ = auVar111._0_2_;
  auVar41._3_12_ = SUB1512(auVar104 << 0x20,3);
  auVar47._2_13_ = auVar41._2_13_;
  auVar47._0_2_ = auVar111._0_2_ & 0xff;
  auVar111 = *(undefined1 (*) [16])thresh1;
  auVar7[0xd] = 0;
  auVar7._0_13_ = auVar111._0_13_;
  auVar7[0xe] = auVar111[7];
  auVar13[0xc] = auVar111[6];
  auVar13._0_12_ = auVar111._0_12_;
  auVar13._13_2_ = auVar7._13_2_;
  auVar19[0xb] = 0;
  auVar19._0_11_ = auVar111._0_11_;
  auVar19._12_3_ = auVar13._12_3_;
  auVar25[10] = auVar111[5];
  auVar25._0_10_ = auVar111._0_10_;
  auVar25._11_4_ = auVar19._11_4_;
  auVar31[9] = 0;
  auVar31._0_9_ = auVar111._0_9_;
  auVar31._10_5_ = auVar25._10_5_;
  auVar37[8] = auVar111[4];
  auVar37._0_8_ = auVar111._0_8_;
  auVar37._9_6_ = auVar31._9_6_;
  auVar90._7_8_ = 0;
  auVar90._0_7_ = auVar37._8_7_;
  auVar105._1_8_ = SUB158(auVar90 << 0x40,7);
  auVar105[0] = auVar111[3];
  auVar105._9_6_ = 0;
  auVar106._1_10_ = SUB1510(auVar105 << 0x30,5);
  auVar106[0] = auVar111[2];
  auVar106._11_4_ = 0;
  auVar42[2] = auVar111[1];
  auVar42._0_2_ = auVar111._0_2_;
  auVar42._3_12_ = SUB1512(auVar106 << 0x20,3);
  auVar48._2_13_ = auVar42._2_13_;
  auVar48._0_2_ = auVar111._0_2_ & 0xff;
  auVar265._0_8_ = auVar47._0_8_;
  auVar265._8_8_ = auVar48._0_8_;
  auVar111 = psubusw(auVar133,auVar197);
  auVar142 = psubusw(auVar197,auVar133);
  auVar112 = psubusw(auVar296,auVar242);
  auVar161 = psubusw(auVar242,auVar296);
  auVar161 = auVar161 | auVar112;
  auVar111 = paddusw(auVar142 | auVar111,auVar142 | auVar111);
  auVar162._0_2_ = auVar161._0_2_ >> 1;
  auVar162._2_2_ = auVar161._2_2_ >> 1;
  auVar162._4_2_ = auVar161._4_2_ >> 1;
  auVar162._6_2_ = auVar161._6_2_ >> 1;
  auVar162._8_2_ = auVar161._8_2_ >> 1;
  auVar162._10_2_ = auVar161._10_2_ >> 1;
  auVar162._12_2_ = auVar161._12_2_ >> 1;
  auVar162._14_2_ = auVar161._14_2_ >> 1;
  auVar111 = paddusw(auVar162,auVar111);
  auVar111 = auVar111 ^ _DAT_004dd1a0;
  auVar254 = auVar254 ^ _DAT_004dd1a0;
  auVar163._0_2_ = -(ushort)(auVar254._0_2_ < auVar111._0_2_);
  auVar163._2_2_ = -(ushort)(auVar254._2_2_ < auVar111._2_2_);
  auVar163._4_2_ = -(ushort)(auVar254._4_2_ < auVar111._4_2_);
  auVar163._6_2_ = -(ushort)(auVar254._6_2_ < auVar111._6_2_);
  auVar163._8_2_ = -(ushort)(auVar254._8_2_ < auVar111._8_2_);
  auVar163._10_2_ = -(ushort)(auVar254._10_2_ < auVar111._10_2_);
  auVar163._12_2_ = -(ushort)(auVar254._12_2_ < auVar111._12_2_);
  auVar163._14_2_ = -(ushort)(auVar254._14_2_ < auVar111._14_2_);
  auVar112 = paddusw(auVar187,_DAT_004dd1b0);
  auVar112 = auVar112 & auVar163;
  auVar111 = psubusw(auVar287,auVar243);
  auVar161 = psubusw(auVar243,auVar287);
  auVar161 = auVar161 | auVar111;
  auVar111 = psubusw(auVar243,auVar296);
  auVar142 = psubusw(auVar296,auVar243);
  auVar142 = auVar142 | auVar111;
  sVar138 = auVar161._0_2_;
  sVar148 = auVar142._0_2_;
  uVar159 = (ushort)(sVar148 < sVar138) * sVar138 | (ushort)(sVar148 >= sVar138) * sVar148;
  sVar138 = auVar161._2_2_;
  sVar148 = auVar142._2_2_;
  uVar169 = (ushort)(sVar148 < sVar138) * sVar138 | (ushort)(sVar148 >= sVar138) * sVar148;
  sVar138 = auVar161._4_2_;
  sVar148 = auVar142._4_2_;
  uVar170 = (ushort)(sVar148 < sVar138) * sVar138 | (ushort)(sVar148 >= sVar138) * sVar148;
  sVar138 = auVar161._6_2_;
  sVar148 = auVar142._6_2_;
  uVar171 = (ushort)(sVar148 < sVar138) * sVar138 | (ushort)(sVar148 >= sVar138) * sVar148;
  sVar138 = auVar161._8_2_;
  sVar148 = auVar142._8_2_;
  uVar173 = (ushort)(sVar148 < sVar138) * sVar138 | (ushort)(sVar148 >= sVar138) * sVar148;
  sVar138 = auVar161._10_2_;
  sVar148 = auVar142._10_2_;
  uVar175 = (ushort)(sVar148 < sVar138) * sVar138 | (ushort)(sVar148 >= sVar138) * sVar148;
  sVar138 = auVar161._12_2_;
  sVar148 = auVar142._12_2_;
  sVar149 = auVar142._14_2_;
  uVar177 = (ushort)(sVar148 < sVar138) * sVar138 | (ushort)(sVar148 >= sVar138) * sVar148;
  sVar138 = auVar161._14_2_;
  uVar179 = (ushort)(sVar149 < sVar138) * sVar138 | (ushort)(sVar149 >= sVar138) * sVar149;
  auVar111 = psubusw(auVar296,auVar133);
  auVar142 = psubusw(auVar133,auVar296);
  auVar142 = auVar142 | auVar111;
  auVar111 = psubusw(auVar242,auVar197);
  auVar161 = psubusw(auVar197,auVar242);
  auVar161 = auVar161 | auVar111;
  sVar138 = auVar142._0_2_;
  sVar148 = auVar161._0_2_;
  auVar255._0_2_ = (ushort)(sVar148 < sVar138) * sVar138 | (ushort)(sVar148 >= sVar138) * sVar148;
  sVar138 = auVar142._2_2_;
  sVar148 = auVar161._2_2_;
  auVar255._2_2_ = (ushort)(sVar148 < sVar138) * sVar138 | (ushort)(sVar148 >= sVar138) * sVar148;
  sVar138 = auVar142._4_2_;
  sVar148 = auVar161._4_2_;
  auVar255._4_2_ = (ushort)(sVar148 < sVar138) * sVar138 | (ushort)(sVar148 >= sVar138) * sVar148;
  sVar138 = auVar142._6_2_;
  sVar148 = auVar161._6_2_;
  auVar255._6_2_ = (ushort)(sVar148 < sVar138) * sVar138 | (ushort)(sVar148 >= sVar138) * sVar148;
  sVar138 = auVar142._8_2_;
  sVar148 = auVar161._8_2_;
  auVar255._8_2_ = (ushort)(sVar148 < sVar138) * sVar138 | (ushort)(sVar148 >= sVar138) * sVar148;
  sVar138 = auVar142._10_2_;
  sVar148 = auVar161._10_2_;
  auVar255._10_2_ = (ushort)(sVar148 < sVar138) * sVar138 | (ushort)(sVar148 >= sVar138) * sVar148;
  sVar138 = auVar142._12_2_;
  sVar148 = auVar161._12_2_;
  sVar149 = auVar161._14_2_;
  auVar255._12_2_ = (ushort)(sVar148 < sVar138) * sVar138 | (ushort)(sVar148 >= sVar138) * sVar148;
  sVar138 = auVar142._14_2_;
  auVar255._14_2_ = (ushort)(sVar149 < sVar138) * sVar138 | (ushort)(sVar149 >= sVar138) * sVar149;
  auVar111 = psubusw(auVar289,auVar242);
  auVar142 = psubusw(auVar242,auVar289);
  auVar142 = auVar142 | auVar111;
  auVar111._4_2_ = sVar157;
  auVar111._0_4_ = auVar271._12_4_;
  auVar111._6_2_ = uVar64;
  auVar111._8_2_ = sVar127;
  auVar111._10_2_ = uVar72;
  auVar111._12_2_ = sVar178;
  auVar111._14_2_ = uVar80;
  auVar161 = psubusw(auVar289,auVar111);
  auVar111 = psubusw(auVar111,auVar289);
  auVar111 = auVar111 | auVar161;
  sVar138 = auVar142._0_2_;
  sVar148 = auVar111._0_2_;
  uVar109 = (ushort)(sVar148 < sVar138) * sVar138 | (ushort)(sVar148 >= sVar138) * sVar148;
  sVar138 = auVar142._2_2_;
  sVar148 = auVar111._2_2_;
  uVar118 = (ushort)(sVar148 < sVar138) * sVar138 | (ushort)(sVar148 >= sVar138) * sVar148;
  sVar138 = auVar142._4_2_;
  sVar148 = auVar111._4_2_;
  uVar119 = (ushort)(sVar148 < sVar138) * sVar138 | (ushort)(sVar148 >= sVar138) * sVar148;
  sVar138 = auVar142._6_2_;
  sVar148 = auVar111._6_2_;
  uVar120 = (ushort)(sVar148 < sVar138) * sVar138 | (ushort)(sVar148 >= sVar138) * sVar148;
  sVar138 = auVar142._8_2_;
  sVar148 = auVar111._8_2_;
  uVar122 = (ushort)(sVar148 < sVar138) * sVar138 | (ushort)(sVar148 >= sVar138) * sVar148;
  sVar138 = auVar142._10_2_;
  sVar148 = auVar111._10_2_;
  uVar124 = (ushort)(sVar148 < sVar138) * sVar138 | (ushort)(sVar148 >= sVar138) * sVar148;
  sVar138 = auVar142._12_2_;
  sVar148 = auVar111._12_2_;
  sVar149 = auVar111._14_2_;
  uVar126 = (ushort)(sVar148 < sVar138) * sVar138 | (ushort)(sVar148 >= sVar138) * sVar148;
  sVar138 = auVar142._14_2_;
  uVar128 = (ushort)(sVar149 < sVar138) * sVar138 | (ushort)(sVar149 >= sVar138) * sVar149;
  uVar159 = ((short)uVar159 < (short)auVar255._0_2_) * auVar255._0_2_ |
            ((short)uVar159 >= (short)auVar255._0_2_) * uVar159;
  uVar169 = ((short)uVar169 < (short)auVar255._2_2_) * auVar255._2_2_ |
            ((short)uVar169 >= (short)auVar255._2_2_) * uVar169;
  uVar170 = ((short)uVar170 < (short)auVar255._4_2_) * auVar255._4_2_ |
            ((short)uVar170 >= (short)auVar255._4_2_) * uVar170;
  uVar171 = ((short)uVar171 < (short)auVar255._6_2_) * auVar255._6_2_ |
            ((short)uVar171 >= (short)auVar255._6_2_) * uVar171;
  uVar173 = ((short)uVar173 < (short)auVar255._8_2_) * auVar255._8_2_ |
            ((short)uVar173 >= (short)auVar255._8_2_) * uVar173;
  uVar175 = ((short)uVar175 < (short)auVar255._10_2_) * auVar255._10_2_ |
            ((short)uVar175 >= (short)auVar255._10_2_) * uVar175;
  uVar177 = ((short)uVar177 < (short)auVar255._12_2_) * auVar255._12_2_ |
            ((short)uVar177 >= (short)auVar255._12_2_) * uVar177;
  uVar179 = ((short)uVar179 < (short)auVar255._14_2_) * auVar255._14_2_ |
            ((short)uVar179 >= (short)auVar255._14_2_) * uVar179;
  uVar109 = ((short)uVar109 < (short)uVar159) * uVar159 |
            ((short)uVar109 >= (short)uVar159) * uVar109;
  uVar118 = ((short)uVar118 < (short)uVar169) * uVar169 |
            ((short)uVar118 >= (short)uVar169) * uVar118;
  uVar119 = ((short)uVar119 < (short)uVar170) * uVar170 |
            ((short)uVar119 >= (short)uVar170) * uVar119;
  uVar120 = ((short)uVar120 < (short)uVar171) * uVar171 |
            ((short)uVar120 >= (short)uVar171) * uVar120;
  uVar122 = ((short)uVar122 < (short)uVar173) * uVar173 |
            ((short)uVar122 >= (short)uVar173) * uVar122;
  uVar124 = ((short)uVar124 < (short)uVar175) * uVar175 |
            ((short)uVar124 >= (short)uVar175) * uVar124;
  uVar126 = ((short)uVar126 < (short)uVar177) * uVar177 |
            ((short)uVar126 >= (short)uVar177) * uVar126;
  uVar128 = ((short)uVar128 < (short)uVar179) * uVar179 |
            ((short)uVar128 >= (short)uVar179) * uVar128;
  sVar138 = auVar112._0_2_;
  auVar142._0_2_ =
       (ushort)((short)uVar109 < sVar138) * sVar138 | ((short)uVar109 >= sVar138) * uVar109;
  sVar138 = auVar112._2_2_;
  auVar142._2_2_ =
       (ushort)((short)uVar118 < sVar138) * sVar138 | ((short)uVar118 >= sVar138) * uVar118;
  sVar138 = auVar112._4_2_;
  auVar142._4_2_ =
       (ushort)((short)uVar119 < sVar138) * sVar138 | ((short)uVar119 >= sVar138) * uVar119;
  sVar138 = auVar112._6_2_;
  auVar142._6_2_ =
       (ushort)((short)uVar120 < sVar138) * sVar138 | ((short)uVar120 >= sVar138) * uVar120;
  sVar138 = auVar112._8_2_;
  auVar142._8_2_ =
       (ushort)((short)uVar122 < sVar138) * sVar138 | ((short)uVar122 >= sVar138) * uVar122;
  sVar138 = auVar112._10_2_;
  auVar142._10_2_ =
       (ushort)((short)uVar124 < sVar138) * sVar138 | ((short)uVar124 >= sVar138) * uVar124;
  sVar138 = auVar112._12_2_;
  auVar142._12_2_ =
       (ushort)((short)uVar126 < sVar138) * sVar138 | ((short)uVar126 >= sVar138) * uVar126;
  sVar138 = auVar112._14_2_;
  auVar142._14_2_ =
       (ushort)((short)uVar128 < sVar138) * sVar138 | ((short)uVar128 >= sVar138) * uVar128;
  auVar142 = auVar142 ^ _DAT_004dd1a0;
  auVar187 = auVar187 ^ _DAT_004dd1a0;
  auVar161._0_2_ = -(ushort)(auVar187._0_2_ < auVar142._0_2_);
  auVar161._2_2_ = -(ushort)(auVar187._2_2_ < auVar142._2_2_);
  auVar161._4_2_ = -(ushort)(auVar187._4_2_ < auVar142._4_2_);
  auVar161._6_2_ = -(ushort)(auVar187._6_2_ < auVar142._6_2_);
  auVar161._8_2_ = -(ushort)(auVar187._8_2_ < auVar142._8_2_);
  auVar161._10_2_ = -(ushort)(auVar187._10_2_ < auVar142._10_2_);
  auVar161._12_2_ = -(ushort)(auVar187._12_2_ < auVar142._12_2_);
  auVar161._14_2_ = -(ushort)(auVar187._14_2_ < auVar142._14_2_);
  auVar288 = psllw(_DAT_004dd1b0,ZEXT416((uint)bd));
  auVar111 = psubusw(auVar243,auVar133);
  auVar112 = psubusw(auVar133,auVar243);
  auVar112 = auVar112 | auVar111;
  auVar111 = psubusw(auVar289,auVar197);
  auVar142 = psubusw(auVar197,auVar289);
  auVar142 = auVar142 | auVar111;
  auVar111 = psllw(auVar265,auVar141);
  sVar138 = auVar112._0_2_;
  sVar148 = auVar142._0_2_;
  uVar109 = (ushort)(sVar148 < sVar138) * sVar138 | (ushort)(sVar148 >= sVar138) * sVar148;
  sVar138 = auVar112._2_2_;
  sVar148 = auVar142._2_2_;
  uVar118 = (ushort)(sVar148 < sVar138) * sVar138 | (ushort)(sVar148 >= sVar138) * sVar148;
  sVar138 = auVar112._4_2_;
  sVar148 = auVar142._4_2_;
  uVar119 = (ushort)(sVar148 < sVar138) * sVar138 | (ushort)(sVar148 >= sVar138) * sVar148;
  sVar138 = auVar112._6_2_;
  sVar148 = auVar142._6_2_;
  uVar120 = (ushort)(sVar148 < sVar138) * sVar138 | (ushort)(sVar148 >= sVar138) * sVar148;
  sVar138 = auVar112._8_2_;
  sVar148 = auVar142._8_2_;
  uVar122 = (ushort)(sVar148 < sVar138) * sVar138 | (ushort)(sVar148 >= sVar138) * sVar148;
  sVar138 = auVar112._10_2_;
  sVar148 = auVar142._10_2_;
  uVar124 = (ushort)(sVar148 < sVar138) * sVar138 | (ushort)(sVar148 >= sVar138) * sVar148;
  sVar138 = auVar112._12_2_;
  sVar148 = auVar142._12_2_;
  sVar149 = auVar142._14_2_;
  uVar126 = (ushort)(sVar148 < sVar138) * sVar138 | (ushort)(sVar148 >= sVar138) * sVar148;
  sVar138 = auVar112._14_2_;
  uVar128 = (ushort)(sVar149 < sVar138) * sVar138 | (ushort)(sVar149 >= sVar138) * sVar149;
  uVar109 = ((short)uVar109 < (short)auVar255._0_2_) * auVar255._0_2_ |
            ((short)uVar109 >= (short)auVar255._0_2_) * uVar109;
  uVar118 = ((short)uVar118 < (short)auVar255._2_2_) * auVar255._2_2_ |
            ((short)uVar118 >= (short)auVar255._2_2_) * uVar118;
  uVar119 = ((short)uVar119 < (short)auVar255._4_2_) * auVar255._4_2_ |
            ((short)uVar119 >= (short)auVar255._4_2_) * uVar119;
  uVar120 = ((short)uVar120 < (short)auVar255._6_2_) * auVar255._6_2_ |
            ((short)uVar120 >= (short)auVar255._6_2_) * uVar120;
  uVar122 = ((short)uVar122 < (short)auVar255._8_2_) * auVar255._8_2_ |
            ((short)uVar122 >= (short)auVar255._8_2_) * uVar122;
  uVar124 = ((short)uVar124 < (short)auVar255._10_2_) * auVar255._10_2_ |
            ((short)uVar124 >= (short)auVar255._10_2_) * uVar124;
  uVar126 = ((short)uVar126 < (short)auVar255._12_2_) * auVar255._12_2_ |
            ((short)uVar126 >= (short)auVar255._12_2_) * uVar126;
  uVar128 = ((short)uVar128 < (short)auVar255._14_2_) * auVar255._14_2_ |
            ((short)uVar128 >= (short)auVar255._14_2_) * uVar128;
  auVar255 = auVar255 ^ _DAT_004dd1a0;
  auVar111 = auVar111 ^ _DAT_004dd1a0;
  auVar256._0_2_ = -(ushort)(auVar111._0_2_ < auVar255._0_2_);
  auVar256._2_2_ = -(ushort)(auVar111._2_2_ < auVar255._2_2_);
  auVar256._4_2_ = -(ushort)(auVar111._4_2_ < auVar255._4_2_);
  auVar256._6_2_ = -(ushort)(auVar111._6_2_ < auVar255._6_2_);
  auVar256._8_2_ = -(ushort)(auVar111._8_2_ < auVar255._8_2_);
  auVar256._10_2_ = -(ushort)(auVar111._10_2_ < auVar255._10_2_);
  auVar256._12_2_ = -(ushort)(auVar111._12_2_ < auVar255._12_2_);
  auVar256._14_2_ = -(ushort)(auVar111._14_2_ < auVar255._14_2_);
  auVar111 = ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f)));
  auVar111 = pshuflw(auVar111,auVar111,0);
  uVar139 = auVar111._0_4_;
  auVar293._4_4_ = uVar139;
  auVar293._0_4_ = uVar139;
  auVar293._8_4_ = uVar139;
  auVar293._12_4_ = uVar139;
  auVar254 = psubsw(auVar133,auVar293);
  auVar143 = psubsw(auVar296,auVar293);
  auVar266 = psubsw(auVar197,auVar293);
  auVar272 = psubsw(auVar242,auVar293);
  auVar187._8_4_ = 0xffffffff;
  auVar187._0_8_ = 0xffffffffffffffff;
  auVar187._12_4_ = 0xffffffff;
  auVar111 = paddsw(auVar288,auVar187);
  auVar142 = psubsw(auVar111,auVar293);
  auVar112 = psubsw((undefined1  [16])0x0,auVar293);
  auVar111 = psubsw(auVar143,auVar272);
  sVar194 = auVar142._0_2_;
  sVar138 = auVar111._0_2_;
  uVar159 = (ushort)(sVar194 < sVar138) * sVar194 | (ushort)(sVar194 >= sVar138) * sVar138;
  sVar195 = auVar142._2_2_;
  sVar138 = auVar111._2_2_;
  uVar169 = (ushort)(sVar195 < sVar138) * sVar195 | (ushort)(sVar195 >= sVar138) * sVar138;
  sVar196 = auVar142._4_2_;
  sVar138 = auVar111._4_2_;
  uVar170 = (ushort)(sVar196 < sVar138) * sVar196 | (ushort)(sVar196 >= sVar138) * sVar138;
  sVar198 = auVar142._6_2_;
  sVar138 = auVar111._6_2_;
  uVar171 = (ushort)(sVar198 < sVar138) * sVar198 | (ushort)(sVar198 >= sVar138) * sVar138;
  sVar199 = auVar142._8_2_;
  sVar138 = auVar111._8_2_;
  uVar173 = (ushort)(sVar199 < sVar138) * sVar199 | (ushort)(sVar199 >= sVar138) * sVar138;
  sVar200 = auVar142._10_2_;
  sVar138 = auVar111._10_2_;
  uVar175 = (ushort)(sVar200 < sVar138) * sVar200 | (ushort)(sVar200 >= sVar138) * sVar138;
  sVar201 = auVar142._12_2_;
  sVar138 = auVar111._12_2_;
  sVar148 = auVar111._14_2_;
  uVar177 = (ushort)(sVar201 < sVar138) * sVar201 | (ushort)(sVar201 >= sVar138) * sVar138;
  sVar202 = auVar142._14_2_;
  uVar179 = (ushort)(sVar202 < sVar148) * sVar202 | (ushort)(sVar202 >= sVar148) * sVar148;
  sVar138 = auVar112._0_2_;
  auVar188._0_2_ =
       (ushort)((short)uVar159 < sVar138) * sVar138 | ((short)uVar159 >= sVar138) * uVar159;
  sVar149 = auVar112._2_2_;
  auVar188._2_2_ =
       (ushort)((short)uVar169 < sVar149) * sVar149 | ((short)uVar169 >= sVar149) * uVar169;
  sVar150 = auVar112._4_2_;
  auVar188._4_2_ =
       (ushort)((short)uVar170 < sVar150) * sVar150 | ((short)uVar170 >= sVar150) * uVar170;
  sVar152 = auVar112._6_2_;
  auVar188._6_2_ =
       (ushort)((short)uVar171 < sVar152) * sVar152 | ((short)uVar171 >= sVar152) * uVar171;
  sVar154 = auVar112._8_2_;
  auVar188._8_2_ =
       (ushort)((short)uVar173 < sVar154) * sVar154 | ((short)uVar173 >= sVar154) * uVar173;
  sVar156 = auVar112._10_2_;
  auVar188._10_2_ =
       (ushort)((short)uVar175 < sVar156) * sVar156 | ((short)uVar175 >= sVar156) * uVar175;
  sVar158 = auVar112._12_2_;
  auVar188._12_2_ =
       (ushort)((short)uVar177 < sVar158) * sVar158 | ((short)uVar177 >= sVar158) * uVar177;
  sVar193 = auVar112._14_2_;
  auVar188._14_2_ =
       (ushort)((short)uVar179 < sVar193) * sVar193 | ((short)uVar179 >= sVar193) * uVar179;
  auVar112 = psubsw(auVar266,auVar254);
  auVar111 = paddsw(auVar188 & auVar256,auVar112);
  auVar111 = paddsw(auVar111,auVar112);
  auVar111 = paddsw(auVar111,auVar112);
  sVar148 = auVar111._0_2_;
  uVar159 = (ushort)(sVar194 < sVar148) * sVar194 | (ushort)(sVar194 >= sVar148) * sVar148;
  sVar148 = auVar111._2_2_;
  uVar169 = (ushort)(sVar195 < sVar148) * sVar195 | (ushort)(sVar195 >= sVar148) * sVar148;
  sVar148 = auVar111._4_2_;
  uVar170 = (ushort)(sVar196 < sVar148) * sVar196 | (ushort)(sVar196 >= sVar148) * sVar148;
  sVar148 = auVar111._6_2_;
  uVar171 = (ushort)(sVar198 < sVar148) * sVar198 | (ushort)(sVar198 >= sVar148) * sVar148;
  sVar148 = auVar111._8_2_;
  uVar173 = (ushort)(sVar199 < sVar148) * sVar199 | (ushort)(sVar199 >= sVar148) * sVar148;
  sVar148 = auVar111._10_2_;
  uVar175 = (ushort)(sVar200 < sVar148) * sVar200 | (ushort)(sVar200 >= sVar148) * sVar148;
  sVar148 = auVar111._12_2_;
  sVar203 = auVar111._14_2_;
  uVar177 = (ushort)(sVar201 < sVar148) * sVar201 | (ushort)(sVar201 >= sVar148) * sVar148;
  uVar179 = (ushort)(sVar202 < sVar203) * sVar202 | (ushort)(sVar202 >= sVar203) * sVar203;
  auVar189._0_2_ =
       (ushort)((short)uVar159 < sVar138) * sVar138 | ((short)uVar159 >= sVar138) * uVar159;
  auVar189._2_2_ =
       (ushort)((short)uVar169 < sVar149) * sVar149 | ((short)uVar169 >= sVar149) * uVar169;
  auVar189._4_2_ =
       (ushort)((short)uVar170 < sVar150) * sVar150 | ((short)uVar170 >= sVar150) * uVar170;
  auVar189._6_2_ =
       (ushort)((short)uVar171 < sVar152) * sVar152 | ((short)uVar171 >= sVar152) * uVar171;
  auVar189._8_2_ =
       (ushort)((short)uVar173 < sVar154) * sVar154 | ((short)uVar173 >= sVar154) * uVar173;
  auVar189._10_2_ =
       (ushort)((short)uVar175 < sVar156) * sVar156 | ((short)uVar175 >= sVar156) * uVar175;
  auVar189._12_2_ =
       (ushort)((short)uVar177 < sVar158) * sVar158 | ((short)uVar177 >= sVar158) * uVar177;
  auVar189._14_2_ =
       (ushort)((short)uVar179 < sVar193) * sVar193 | ((short)uVar179 >= sVar193) * uVar179;
  auVar112 = psubusw(auVar287,auVar133);
  auVar111 = psubusw(auVar133,auVar287);
  auVar111 = auVar111 | auVar112;
  auVar112._4_2_ = sVar157;
  auVar112._0_4_ = auVar271._12_4_;
  auVar112._6_2_ = uVar64;
  auVar112._8_2_ = sVar127;
  auVar112._10_2_ = uVar72;
  auVar112._12_2_ = sVar178;
  auVar112._14_2_ = uVar80;
  auVar142 = psubusw(auVar112,auVar197);
  auVar112 = psubusw(auVar197,auVar112);
  auVar112 = auVar112 | auVar142;
  sVar148 = auVar111._0_2_;
  sVar203 = auVar112._0_2_;
  uVar159 = (ushort)(sVar203 < sVar148) * sVar148 | (ushort)(sVar203 >= sVar148) * sVar203;
  sVar148 = auVar111._2_2_;
  sVar203 = auVar112._2_2_;
  uVar169 = (ushort)(sVar203 < sVar148) * sVar148 | (ushort)(sVar203 >= sVar148) * sVar203;
  sVar148 = auVar111._4_2_;
  sVar203 = auVar112._4_2_;
  uVar170 = (ushort)(sVar203 < sVar148) * sVar148 | (ushort)(sVar203 >= sVar148) * sVar203;
  sVar148 = auVar111._6_2_;
  sVar203 = auVar112._6_2_;
  uVar171 = (ushort)(sVar203 < sVar148) * sVar148 | (ushort)(sVar203 >= sVar148) * sVar203;
  sVar148 = auVar111._8_2_;
  sVar203 = auVar112._8_2_;
  uVar173 = (ushort)(sVar203 < sVar148) * sVar148 | (ushort)(sVar203 >= sVar148) * sVar203;
  sVar148 = auVar111._10_2_;
  sVar203 = auVar112._10_2_;
  uVar175 = (ushort)(sVar203 < sVar148) * sVar148 | (ushort)(sVar203 >= sVar148) * sVar203;
  sVar148 = auVar111._12_2_;
  sVar203 = auVar112._12_2_;
  sVar204 = auVar112._14_2_;
  uVar177 = (ushort)(sVar203 < sVar148) * sVar148 | (ushort)(sVar203 >= sVar148) * sVar203;
  sVar148 = auVar111._14_2_;
  uVar179 = (ushort)(sVar204 < sVar148) * sVar148 | (ushort)(sVar204 >= sVar148) * sVar204;
  auVar111 = psllw(_DAT_004dd1b0,auVar141);
  auVar190._0_2_ =
       ((short)uVar159 < (short)uVar109) * uVar109 | ((short)uVar159 >= (short)uVar109) * uVar159;
  auVar190._2_2_ =
       ((short)uVar169 < (short)uVar118) * uVar118 | ((short)uVar169 >= (short)uVar118) * uVar169;
  auVar190._4_2_ =
       ((short)uVar170 < (short)uVar119) * uVar119 | ((short)uVar170 >= (short)uVar119) * uVar170;
  auVar190._6_2_ =
       ((short)uVar171 < (short)uVar120) * uVar120 | ((short)uVar171 >= (short)uVar120) * uVar171;
  auVar190._8_2_ =
       ((short)uVar173 < (short)uVar122) * uVar122 | ((short)uVar173 >= (short)uVar122) * uVar173;
  auVar190._10_2_ =
       ((short)uVar175 < (short)uVar124) * uVar124 | ((short)uVar175 >= (short)uVar124) * uVar175;
  auVar190._12_2_ =
       ((short)uVar177 < (short)uVar126) * uVar126 | ((short)uVar177 >= (short)uVar126) * uVar177;
  auVar190._14_2_ =
       ((short)uVar179 < (short)uVar128) * uVar128 | ((short)uVar179 >= (short)uVar128) * uVar179;
  auVar190 = auVar190 ^ _DAT_004dd1a0;
  auVar111 = auVar111 ^ _DAT_004dd1a0;
  auVar191._0_2_ = -(ushort)(auVar111._0_2_ < auVar190._0_2_);
  auVar191._2_2_ = -(ushort)(auVar111._2_2_ < auVar190._2_2_);
  auVar191._4_2_ = -(ushort)(auVar111._4_2_ < auVar190._4_2_);
  auVar191._6_2_ = -(ushort)(auVar111._6_2_ < auVar190._6_2_);
  auVar191._8_2_ = -(ushort)(auVar111._8_2_ < auVar190._8_2_);
  auVar191._10_2_ = -(ushort)(auVar111._10_2_ < auVar190._10_2_);
  auVar191._12_2_ = -(ushort)(auVar111._12_2_ < auVar190._12_2_);
  auVar191._14_2_ = -(ushort)(auVar111._14_2_ < auVar190._14_2_);
  auVar111 = paddsw(_DAT_004dd090,~auVar161 & auVar189);
  auVar112 = paddsw(~auVar161 & auVar189,_DAT_004dd1d0);
  auVar191 = auVar191 | auVar161;
  sVar148 = auVar112._0_2_;
  uVar109 = (ushort)(sVar194 < sVar148) * sVar194 | (ushort)(sVar194 >= sVar148) * sVar148;
  sVar148 = auVar112._2_2_;
  uVar118 = (ushort)(sVar195 < sVar148) * sVar195 | (ushort)(sVar195 >= sVar148) * sVar148;
  sVar148 = auVar112._4_2_;
  uVar119 = (ushort)(sVar196 < sVar148) * sVar196 | (ushort)(sVar196 >= sVar148) * sVar148;
  sVar148 = auVar112._6_2_;
  uVar120 = (ushort)(sVar198 < sVar148) * sVar198 | (ushort)(sVar198 >= sVar148) * sVar148;
  sVar148 = auVar112._8_2_;
  uVar122 = (ushort)(sVar199 < sVar148) * sVar199 | (ushort)(sVar199 >= sVar148) * sVar148;
  sVar148 = auVar112._10_2_;
  uVar124 = (ushort)(sVar200 < sVar148) * sVar200 | (ushort)(sVar200 >= sVar148) * sVar148;
  sVar148 = auVar112._12_2_;
  sVar203 = auVar112._14_2_;
  uVar126 = (ushort)(sVar201 < sVar148) * sVar201 | (ushort)(sVar201 >= sVar148) * sVar148;
  uVar128 = (ushort)(sVar202 < sVar203) * sVar202 | (ushort)(sVar202 >= sVar203) * sVar203;
  auVar297._0_2_ =
       (ushort)((short)uVar109 < sVar138) * sVar138 | ((short)uVar109 >= sVar138) * uVar109;
  auVar297._2_2_ =
       (ushort)((short)uVar118 < sVar149) * sVar149 | ((short)uVar118 >= sVar149) * uVar118;
  auVar297._4_2_ =
       (ushort)((short)uVar119 < sVar150) * sVar150 | ((short)uVar119 >= sVar150) * uVar119;
  auVar297._6_2_ =
       (ushort)((short)uVar120 < sVar152) * sVar152 | ((short)uVar120 >= sVar152) * uVar120;
  auVar297._8_2_ =
       (ushort)((short)uVar122 < sVar154) * sVar154 | ((short)uVar122 >= sVar154) * uVar122;
  auVar297._10_2_ =
       (ushort)((short)uVar124 < sVar156) * sVar156 | ((short)uVar124 >= sVar156) * uVar124;
  auVar297._12_2_ =
       (ushort)((short)uVar126 < sVar158) * sVar158 | ((short)uVar126 >= sVar158) * uVar126;
  auVar297._14_2_ =
       (ushort)((short)uVar128 < sVar193) * sVar193 | ((short)uVar128 >= sVar193) * uVar128;
  auVar112 = psraw(auVar297,3);
  auVar161 = paddsw(auVar112,auVar254);
  sVar148 = auVar111._0_2_;
  uVar109 = (ushort)(sVar194 < sVar148) * sVar194 | (ushort)(sVar194 >= sVar148) * sVar148;
  sVar148 = auVar111._2_2_;
  uVar118 = (ushort)(sVar195 < sVar148) * sVar195 | (ushort)(sVar195 >= sVar148) * sVar148;
  sVar148 = auVar111._4_2_;
  uVar119 = (ushort)(sVar196 < sVar148) * sVar196 | (ushort)(sVar196 >= sVar148) * sVar148;
  sVar148 = auVar111._6_2_;
  uVar120 = (ushort)(sVar198 < sVar148) * sVar198 | (ushort)(sVar198 >= sVar148) * sVar148;
  sVar148 = auVar111._8_2_;
  uVar122 = (ushort)(sVar199 < sVar148) * sVar199 | (ushort)(sVar199 >= sVar148) * sVar148;
  sVar148 = auVar111._10_2_;
  uVar124 = (ushort)(sVar200 < sVar148) * sVar200 | (ushort)(sVar200 >= sVar148) * sVar148;
  sVar148 = auVar111._12_2_;
  sVar203 = auVar111._14_2_;
  uVar126 = (ushort)(sVar201 < sVar148) * sVar201 | (ushort)(sVar201 >= sVar148) * sVar148;
  uVar128 = (ushort)(sVar202 < sVar203) * sVar202 | (ushort)(sVar202 >= sVar203) * sVar203;
  auVar141._0_2_ =
       (ushort)((short)uVar109 < sVar138) * sVar138 | ((short)uVar109 >= sVar138) * uVar109;
  auVar141._2_2_ =
       (ushort)((short)uVar118 < sVar149) * sVar149 | ((short)uVar118 >= sVar149) * uVar118;
  auVar141._4_2_ =
       (ushort)((short)uVar119 < sVar150) * sVar150 | ((short)uVar119 >= sVar150) * uVar119;
  auVar141._6_2_ =
       (ushort)((short)uVar120 < sVar152) * sVar152 | ((short)uVar120 >= sVar152) * uVar120;
  auVar141._8_2_ =
       (ushort)((short)uVar122 < sVar154) * sVar154 | ((short)uVar122 >= sVar154) * uVar122;
  auVar141._10_2_ =
       (ushort)((short)uVar124 < sVar156) * sVar156 | ((short)uVar124 >= sVar156) * uVar124;
  auVar141._12_2_ =
       (ushort)((short)uVar126 < sVar158) * sVar158 | ((short)uVar126 >= sVar158) * uVar126;
  auVar141._14_2_ =
       (ushort)((short)uVar128 < sVar193) * sVar193 | ((short)uVar128 >= sVar193) * uVar128;
  auVar111 = psraw(auVar141,3);
  auVar112 = psubsw(auVar266,auVar111);
  auVar254._0_2_ = auVar111._0_2_ + 1;
  auVar254._2_2_ = auVar111._2_2_ + 1;
  auVar254._4_2_ = auVar111._4_2_ + 1;
  auVar254._6_2_ = auVar111._6_2_ + 1;
  auVar254._8_2_ = auVar111._8_2_ + 1;
  auVar254._10_2_ = auVar111._10_2_ + 1;
  auVar254._12_2_ = auVar111._12_2_ + 1;
  auVar254._14_2_ = auVar111._14_2_ + 1;
  auVar111 = psraw(auVar254,1);
  auVar142 = psubsw(auVar272,~auVar256 & auVar111);
  auVar111 = paddsw(~auVar256 & auVar111,auVar143);
  sVar148 = auVar112._0_2_;
  uVar159 = (ushort)(sVar194 < sVar148) * sVar194 | (ushort)(sVar194 >= sVar148) * sVar148;
  sVar148 = auVar112._2_2_;
  uVar169 = (ushort)(sVar195 < sVar148) * sVar195 | (ushort)(sVar195 >= sVar148) * sVar148;
  sVar148 = auVar112._4_2_;
  uVar170 = (ushort)(sVar196 < sVar148) * sVar196 | (ushort)(sVar196 >= sVar148) * sVar148;
  sVar148 = auVar112._6_2_;
  uVar171 = (ushort)(sVar198 < sVar148) * sVar198 | (ushort)(sVar198 >= sVar148) * sVar148;
  sVar148 = auVar112._8_2_;
  uVar173 = (ushort)(sVar199 < sVar148) * sVar199 | (ushort)(sVar199 >= sVar148) * sVar148;
  sVar148 = auVar112._10_2_;
  uVar175 = (ushort)(sVar200 < sVar148) * sVar200 | (ushort)(sVar200 >= sVar148) * sVar148;
  sVar148 = auVar112._12_2_;
  sVar203 = auVar112._14_2_;
  uVar177 = (ushort)(sVar201 < sVar148) * sVar201 | (ushort)(sVar201 >= sVar148) * sVar148;
  uVar179 = (ushort)(sVar202 < sVar203) * sVar202 | (ushort)(sVar202 >= sVar203) * sVar203;
  sVar148 = auVar161._0_2_;
  uVar295 = (ushort)(sVar194 < sVar148) * sVar194 | (ushort)(sVar194 >= sVar148) * sVar148;
  sVar148 = auVar161._2_2_;
  uVar299 = (ushort)(sVar195 < sVar148) * sVar195 | (ushort)(sVar195 >= sVar148) * sVar148;
  sVar148 = auVar161._4_2_;
  uVar300 = (ushort)(sVar196 < sVar148) * sVar196 | (ushort)(sVar196 >= sVar148) * sVar148;
  sVar148 = auVar161._6_2_;
  uVar301 = (ushort)(sVar198 < sVar148) * sVar198 | (ushort)(sVar198 >= sVar148) * sVar148;
  sVar148 = auVar161._8_2_;
  uVar302 = (ushort)(sVar199 < sVar148) * sVar199 | (ushort)(sVar199 >= sVar148) * sVar148;
  sVar148 = auVar161._10_2_;
  uVar303 = (ushort)(sVar200 < sVar148) * sVar200 | (ushort)(sVar200 >= sVar148) * sVar148;
  sVar148 = auVar161._12_2_;
  sVar203 = auVar161._14_2_;
  uVar304 = (ushort)(sVar201 < sVar148) * sVar201 | (ushort)(sVar201 >= sVar148) * sVar148;
  uVar305 = (ushort)(sVar202 < sVar203) * sVar202 | (ushort)(sVar202 >= sVar203) * sVar203;
  sVar148 = auVar142._0_2_;
  uVar269 = (ushort)(sVar194 < sVar148) * sVar194 | (ushort)(sVar194 >= sVar148) * sVar148;
  sVar148 = auVar142._2_2_;
  uVar274 = (ushort)(sVar195 < sVar148) * sVar195 | (ushort)(sVar195 >= sVar148) * sVar148;
  sVar148 = auVar142._4_2_;
  uVar275 = (ushort)(sVar196 < sVar148) * sVar196 | (ushort)(sVar196 >= sVar148) * sVar148;
  sVar148 = auVar142._6_2_;
  uVar276 = (ushort)(sVar198 < sVar148) * sVar198 | (ushort)(sVar198 >= sVar148) * sVar148;
  sVar148 = auVar142._8_2_;
  uVar278 = (ushort)(sVar199 < sVar148) * sVar199 | (ushort)(sVar199 >= sVar148) * sVar148;
  sVar148 = auVar142._10_2_;
  uVar280 = (ushort)(sVar200 < sVar148) * sVar200 | (ushort)(sVar200 >= sVar148) * sVar148;
  sVar148 = auVar142._12_2_;
  sVar203 = auVar142._14_2_;
  uVar282 = (ushort)(sVar201 < sVar148) * sVar201 | (ushort)(sVar201 >= sVar148) * sVar148;
  uVar284 = (ushort)(sVar202 < sVar203) * sVar202 | (ushort)(sVar202 >= sVar203) * sVar203;
  sVar148 = auVar111._0_2_;
  uVar109 = (ushort)(sVar194 < sVar148) * sVar194 | (ushort)(sVar194 >= sVar148) * sVar148;
  sVar148 = auVar111._2_2_;
  uVar118 = (ushort)(sVar195 < sVar148) * sVar195 | (ushort)(sVar195 >= sVar148) * sVar148;
  sVar148 = auVar111._4_2_;
  uVar119 = (ushort)(sVar196 < sVar148) * sVar196 | (ushort)(sVar196 >= sVar148) * sVar148;
  sVar148 = auVar111._6_2_;
  uVar120 = (ushort)(sVar198 < sVar148) * sVar198 | (ushort)(sVar198 >= sVar148) * sVar148;
  sVar148 = auVar111._8_2_;
  uVar122 = (ushort)(sVar199 < sVar148) * sVar199 | (ushort)(sVar199 >= sVar148) * sVar148;
  sVar148 = auVar111._10_2_;
  uVar124 = (ushort)(sVar200 < sVar148) * sVar200 | (ushort)(sVar200 >= sVar148) * sVar148;
  sVar148 = auVar111._12_2_;
  sVar194 = auVar111._14_2_;
  uVar126 = (ushort)(sVar201 < sVar148) * sVar201 | (ushort)(sVar201 >= sVar148) * sVar148;
  uVar128 = (ushort)(sVar202 < sVar194) * sVar202 | (ushort)(sVar202 >= sVar194) * sVar194;
  auVar267._0_2_ =
       (ushort)((short)uVar159 < sVar138) * sVar138 | ((short)uVar159 >= sVar138) * uVar159;
  auVar267._2_2_ =
       (ushort)((short)uVar169 < sVar149) * sVar149 | ((short)uVar169 >= sVar149) * uVar169;
  auVar267._4_2_ =
       (ushort)((short)uVar170 < sVar150) * sVar150 | ((short)uVar170 >= sVar150) * uVar170;
  auVar267._6_2_ =
       (ushort)((short)uVar171 < sVar152) * sVar152 | ((short)uVar171 >= sVar152) * uVar171;
  auVar267._8_2_ =
       (ushort)((short)uVar173 < sVar154) * sVar154 | ((short)uVar173 >= sVar154) * uVar173;
  auVar267._10_2_ =
       (ushort)((short)uVar175 < sVar156) * sVar156 | ((short)uVar175 >= sVar156) * uVar175;
  auVar267._12_2_ =
       (ushort)((short)uVar177 < sVar158) * sVar158 | ((short)uVar177 >= sVar158) * uVar177;
  auVar267._14_2_ =
       (ushort)((short)uVar179 < sVar193) * sVar193 | ((short)uVar179 >= sVar193) * uVar179;
  auVar298._0_2_ =
       (ushort)((short)uVar295 < sVar138) * sVar138 | ((short)uVar295 >= sVar138) * uVar295;
  auVar298._2_2_ =
       (ushort)((short)uVar299 < sVar149) * sVar149 | ((short)uVar299 >= sVar149) * uVar299;
  auVar298._4_2_ =
       (ushort)((short)uVar300 < sVar150) * sVar150 | ((short)uVar300 >= sVar150) * uVar300;
  auVar298._6_2_ =
       (ushort)((short)uVar301 < sVar152) * sVar152 | ((short)uVar301 >= sVar152) * uVar301;
  auVar298._8_2_ =
       (ushort)((short)uVar302 < sVar154) * sVar154 | ((short)uVar302 >= sVar154) * uVar302;
  auVar298._10_2_ =
       (ushort)((short)uVar303 < sVar156) * sVar156 | ((short)uVar303 >= sVar156) * uVar303;
  auVar298._12_2_ =
       (ushort)((short)uVar304 < sVar158) * sVar158 | ((short)uVar304 >= sVar158) * uVar304;
  auVar298._14_2_ =
       (ushort)((short)uVar305 < sVar193) * sVar193 | ((short)uVar305 >= sVar193) * uVar305;
  auVar273._0_2_ =
       (ushort)((short)uVar269 < sVar138) * sVar138 | ((short)uVar269 >= sVar138) * uVar269;
  auVar273._2_2_ =
       (ushort)((short)uVar274 < sVar149) * sVar149 | ((short)uVar274 >= sVar149) * uVar274;
  auVar273._4_2_ =
       (ushort)((short)uVar275 < sVar150) * sVar150 | ((short)uVar275 >= sVar150) * uVar275;
  auVar273._6_2_ =
       (ushort)((short)uVar276 < sVar152) * sVar152 | ((short)uVar276 >= sVar152) * uVar276;
  auVar273._8_2_ =
       (ushort)((short)uVar278 < sVar154) * sVar154 | ((short)uVar278 >= sVar154) * uVar278;
  auVar273._10_2_ =
       (ushort)((short)uVar280 < sVar156) * sVar156 | ((short)uVar280 >= sVar156) * uVar280;
  auVar273._12_2_ =
       (ushort)((short)uVar282 < sVar158) * sVar158 | ((short)uVar282 >= sVar158) * uVar282;
  auVar273._14_2_ =
       (ushort)((short)uVar284 < sVar193) * sVar193 | ((short)uVar284 >= sVar193) * uVar284;
  auVar257._0_2_ =
       (ushort)((short)uVar109 < sVar138) * sVar138 | ((short)uVar109 >= sVar138) * uVar109;
  auVar257._2_2_ =
       (ushort)((short)uVar118 < sVar149) * sVar149 | ((short)uVar118 >= sVar149) * uVar118;
  auVar257._4_2_ =
       (ushort)((short)uVar119 < sVar150) * sVar150 | ((short)uVar119 >= sVar150) * uVar119;
  auVar257._6_2_ =
       (ushort)((short)uVar120 < sVar152) * sVar152 | ((short)uVar120 >= sVar152) * uVar120;
  auVar257._8_2_ =
       (ushort)((short)uVar122 < sVar154) * sVar154 | ((short)uVar122 >= sVar154) * uVar122;
  auVar257._10_2_ =
       (ushort)((short)uVar124 < sVar156) * sVar156 | ((short)uVar124 >= sVar156) * uVar124;
  auVar257._12_2_ =
       (ushort)((short)uVar126 < sVar158) * sVar158 | ((short)uVar126 >= sVar158) * uVar126;
  auVar257._14_2_ =
       (ushort)((short)uVar128 < sVar193) * sVar193 | ((short)uVar128 >= sVar193) * uVar128;
  auVar112 = paddsw(auVar267,auVar293);
  auVar161 = paddsw(auVar298,auVar293);
  auVar142 = paddsw(auVar273,auVar293);
  auVar111 = paddsw(auVar257,auVar293);
  if ((ushort)((ushort)(SUB161(auVar191 >> 7,0) & 1) | (ushort)(SUB161(auVar191 >> 0xf,0) & 1) << 1
               | (ushort)(SUB161(auVar191 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar191 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar191 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar191 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar191 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar191 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar191 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar191 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar191 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar191 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar191 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar191 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar191 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar191[0xf] >> 7) << 0xf) != 0xffff) {
    sVar193 = sVar136 + sVar135 + sVar137 + sVar131 * 2 + 4;
    sVar198 = uVar51 + uVar50 + uVar52 + uVar49 * 2 + 4;
    sVar202 = sVar233 + sVar232 + sVar234 + sVar226 * 2 + 4;
    sVar206 = uVar59 + uVar58 + uVar60 + uVar57 * 2 + 4;
    sVar210 = sVar245 + sVar244 + sVar246 + sVar235 * 2 + 4;
    sVar214 = uVar67 + uVar66 + uVar68 + uVar65 * 2 + 4;
    sVar218 = sVar260 + sVar259 + sVar261 + sVar247 * 2 + 4;
    sVar222 = uVar75 + uVar74 + uVar76 + uVar73 * 2 + 4;
    sVar138 = sVar277 + sVar279;
    sVar148 = uVar53 + uVar54;
    sVar149 = sVar151 + sVar153;
    sVar150 = uVar61 + uVar62;
    sVar152 = sVar121 + sVar123;
    sVar154 = uVar69 + uVar70;
    sVar156 = sVar172 + sVar174;
    sVar158 = uVar77 + uVar78;
    sVar194 = (sVar193 - sVar131) + sVar281;
    sVar199 = (sVar198 - uVar49) + uVar55;
    sVar203 = (sVar202 - sVar226) + sVar155;
    sVar207 = (sVar206 - uVar57) + uVar63;
    sVar211 = (sVar210 - sVar235) + sVar125;
    sVar215 = (sVar214 - uVar65) + uVar71;
    sVar219 = (sVar218 - sVar247) + sVar176;
    sVar223 = (sVar222 - uVar73) + uVar79;
    sVar195 = (sVar194 - sVar131) + sVar283;
    sVar200 = (sVar199 - uVar49) + uVar56;
    sVar204 = (sVar203 - sVar226) + sVar157;
    sVar208 = (sVar207 - uVar57) + uVar64;
    sVar212 = (sVar211 - sVar235) + sVar127;
    sVar216 = (sVar215 - uVar65) + uVar72;
    sVar220 = (sVar219 - sVar247) + sVar178;
    sVar224 = (sVar223 - uVar73) + uVar80;
    sVar196 = (sVar195 - sVar135) + sVar283;
    sVar201 = (sVar200 - uVar50) + uVar56;
    sVar205 = (sVar204 - sVar232) + sVar157;
    sVar209 = (sVar208 - uVar58) + uVar64;
    sVar213 = (sVar212 - sVar244) + sVar127;
    sVar217 = (sVar216 - uVar66) + uVar72;
    sVar221 = (sVar220 - sVar259) + sVar178;
    sVar225 = (sVar224 - uVar74) + uVar80;
    auVar129._0_2_ = (ushort)((sVar281 - sVar136) + sVar283 + sVar138 + sVar196) >> 3;
    auVar129._2_2_ = (ushort)((uVar55 - uVar51) + uVar56 + sVar148 + sVar201) >> 3;
    auVar129._4_2_ = (ushort)((sVar155 - sVar233) + sVar157 + sVar149 + sVar205) >> 3;
    auVar129._6_2_ = (ushort)((uVar63 - uVar59) + uVar64 + sVar150 + sVar209) >> 3;
    auVar129._8_2_ = (ushort)((sVar125 - sVar245) + sVar127 + sVar152 + sVar213) >> 3;
    auVar129._10_2_ = (ushort)((uVar71 - uVar67) + uVar72 + sVar154 + sVar217) >> 3;
    auVar129._12_2_ = (ushort)((sVar176 - sVar260) + sVar178 + sVar156 + sVar221) >> 3;
    auVar129._14_2_ = (ushort)((uVar79 - uVar75) + uVar80 + sVar158 + sVar225) >> 3;
    auVar113._0_2_ = (ushort)(sVar277 + sVar135 + sVar131 + sVar193) >> 3;
    auVar113._2_2_ = (ushort)(uVar53 + uVar50 + uVar49 + sVar198) >> 3;
    auVar113._4_2_ = (ushort)(sVar151 + sVar232 + sVar226 + sVar202) >> 3;
    auVar113._6_2_ = (ushort)(uVar61 + uVar58 + uVar57 + sVar206) >> 3;
    auVar113._8_2_ = (ushort)(sVar121 + sVar244 + sVar235 + sVar210) >> 3;
    auVar113._10_2_ = (ushort)(uVar69 + uVar66 + uVar65 + sVar214) >> 3;
    auVar113._12_2_ = (ushort)(sVar172 + sVar259 + sVar247 + sVar218) >> 3;
    auVar113._14_2_ = (ushort)(uVar77 + uVar74 + uVar73 + sVar222) >> 3;
    auVar289 = auVar289 & auVar191 | ~auVar191 & auVar129;
    auVar144._0_2_ = (ushort)(sVar138 + sVar136 + sVar193) >> 3;
    auVar144._2_2_ = (ushort)(sVar148 + uVar51 + sVar198) >> 3;
    auVar144._4_2_ = (ushort)(sVar149 + sVar233 + sVar202) >> 3;
    auVar144._6_2_ = (ushort)(sVar150 + uVar59 + sVar206) >> 3;
    auVar144._8_2_ = (ushort)(sVar152 + sVar245 + sVar210) >> 3;
    auVar144._10_2_ = (ushort)(sVar154 + uVar67 + sVar214) >> 3;
    auVar144._12_2_ = (ushort)(sVar156 + sVar260 + sVar218) >> 3;
    auVar144._14_2_ = (ushort)(sVar158 + uVar75 + sVar222) >> 3;
    auVar243 = auVar243 & auVar191 | ~auVar191 & auVar113;
    auVar181._0_2_ = (ushort)(sVar137 + sVar138 + sVar194) >> 3;
    auVar181._2_2_ = (ushort)(uVar52 + sVar148 + sVar199) >> 3;
    auVar181._4_2_ = (ushort)(sVar234 + sVar149 + sVar203) >> 3;
    auVar181._6_2_ = (ushort)(uVar60 + sVar150 + sVar207) >> 3;
    auVar181._8_2_ = (ushort)(sVar246 + sVar152 + sVar211) >> 3;
    auVar181._10_2_ = (ushort)(uVar68 + sVar154 + sVar215) >> 3;
    auVar181._12_2_ = (ushort)(sVar261 + sVar156 + sVar219) >> 3;
    auVar181._14_2_ = (ushort)(uVar76 + sVar158 + sVar223) >> 3;
    auVar111 = auVar111 & auVar191 | ~auVar191 & auVar144;
    auVar134._0_2_ = (ushort)(sVar277 + sVar138 + sVar195) >> 3;
    auVar134._2_2_ = (ushort)(uVar53 + sVar148 + sVar200) >> 3;
    auVar134._4_2_ = (ushort)(sVar151 + sVar149 + sVar204) >> 3;
    auVar134._6_2_ = (ushort)(uVar61 + sVar150 + sVar208) >> 3;
    auVar134._8_2_ = (ushort)(sVar121 + sVar152 + sVar212) >> 3;
    auVar134._10_2_ = (ushort)(uVar69 + sVar154 + sVar216) >> 3;
    auVar134._12_2_ = (ushort)(sVar172 + sVar156 + sVar220) >> 3;
    auVar134._14_2_ = (ushort)(uVar77 + sVar158 + sVar224) >> 3;
    auVar161 = auVar161 & auVar191 | ~auVar191 & auVar181;
    auVar112 = auVar112 & auVar191 | ~auVar191 & auVar134;
    auVar294._0_2_ = (ushort)(sVar279 + sVar138 + sVar196) >> 3;
    auVar294._2_2_ = (ushort)(uVar54 + sVar148 + sVar201) >> 3;
    auVar294._4_2_ = (ushort)(sVar153 + sVar149 + sVar205) >> 3;
    auVar294._6_2_ = (ushort)(uVar62 + sVar150 + sVar209) >> 3;
    auVar294._8_2_ = (ushort)(sVar123 + sVar152 + sVar213) >> 3;
    auVar294._10_2_ = (ushort)(uVar70 + sVar154 + sVar217) >> 3;
    auVar294._12_2_ = (ushort)(sVar174 + sVar156 + sVar221) >> 3;
    auVar294._14_2_ = (ushort)(uVar78 + sVar158 + sVar225) >> 3;
    auVar142 = auVar142 & auVar191 | ~auVar191 & auVar294;
  }
  auVar117._0_12_ = auVar287._0_12_;
  auVar117._12_2_ = uVar57;
  auVar117._14_2_ = auVar243._6_2_;
  auVar116._12_4_ = auVar117._12_4_;
  auVar116._0_10_ = auVar287._0_10_;
  auVar116._10_2_ = auVar243._4_2_;
  auVar115._10_6_ = auVar116._10_6_;
  auVar115._8_2_ = sVar226;
  auVar115._0_8_ = uVar291;
  auVar91._4_8_ = auVar115._8_8_;
  auVar91._2_2_ = auVar243._2_2_;
  auVar91._0_2_ = uVar49;
  auVar114._0_4_ = CONCAT22(auVar243._0_2_,sVar131);
  auVar114._4_12_ = auVar91;
  auVar147._0_12_ = auVar111._0_12_;
  auVar147._12_2_ = auVar111._6_2_;
  auVar147._14_2_ = auVar161._6_2_;
  auVar146._12_4_ = auVar147._12_4_;
  auVar146._0_10_ = auVar111._0_10_;
  auVar146._10_2_ = auVar161._4_2_;
  auVar145._10_6_ = auVar146._10_6_;
  auVar145._0_8_ = auVar111._0_8_;
  auVar145._8_2_ = auVar111._4_2_;
  auVar92._4_8_ = auVar145._8_8_;
  auVar92._2_2_ = auVar161._2_2_;
  auVar92._0_2_ = auVar111._2_2_;
  auVar167._0_12_ = auVar112._0_12_;
  auVar167._12_2_ = auVar112._6_2_;
  auVar167._14_2_ = auVar142._6_2_;
  auVar166._12_4_ = auVar167._12_4_;
  auVar166._0_10_ = auVar112._0_10_;
  auVar166._10_2_ = auVar142._4_2_;
  auVar165._10_6_ = auVar166._10_6_;
  auVar165._0_8_ = auVar112._0_8_;
  auVar165._8_2_ = auVar112._4_2_;
  auVar93._4_8_ = auVar165._8_8_;
  auVar93._2_2_ = auVar142._2_2_;
  auVar93._0_2_ = auVar112._2_2_;
  auVar164._0_4_ = CONCAT22(auVar142._0_2_,auVar112._0_2_);
  auVar164._4_12_ = auVar93;
  auVar184._0_12_ = auVar289._0_12_;
  auVar184._12_2_ = auVar289._6_2_;
  auVar184._14_2_ = uVar64;
  auVar183._12_4_ = auVar184._12_4_;
  auVar183._0_10_ = auVar289._0_10_;
  auVar183._10_2_ = sVar157;
  auVar182._10_6_ = auVar183._10_6_;
  auVar182._0_8_ = auVar289._0_8_;
  auVar182._8_2_ = auVar289._4_2_;
  auVar94._4_8_ = auVar182._8_8_;
  auVar94._2_2_ = uVar56;
  auVar94._0_2_ = auVar289._2_2_;
  auVar130._0_8_ = auVar114._0_8_;
  auVar130._8_4_ = auVar91._0_4_;
  auVar130._12_4_ = auVar92._0_4_;
  auVar192._0_8_ = auVar164._0_8_;
  auVar192._8_4_ = auVar93._0_4_;
  auVar192._12_4_ = auVar94._0_4_;
  uVar139 = CONCAT22(auVar243._8_2_,sVar235);
  auVar227._0_8_ = CONCAT26(auVar243._10_2_,CONCAT24(uVar65,uVar139));
  auVar227._8_2_ = sVar247;
  auVar227._10_2_ = auVar243._12_2_;
  auVar231._12_2_ = uVar73;
  auVar231._0_12_ = auVar227;
  auVar231._14_2_ = auVar243._14_2_;
  uVar248 = CONCAT22(auVar161._8_2_,auVar111._8_2_);
  auVar249._0_8_ = CONCAT26(auVar161._10_2_,CONCAT24(auVar111._10_2_,uVar248));
  auVar249._8_2_ = auVar111._12_2_;
  auVar249._10_2_ = auVar161._12_2_;
  auVar258._12_2_ = auVar111._14_2_;
  auVar258._0_12_ = auVar249;
  auVar258._14_2_ = auVar161._14_2_;
  uVar262 = CONCAT22(auVar142._8_2_,auVar112._8_2_);
  auVar263._0_8_ = CONCAT26(auVar142._10_2_,CONCAT24(auVar112._10_2_,uVar262));
  auVar263._8_2_ = auVar112._12_2_;
  auVar263._10_2_ = auVar142._12_2_;
  auVar268._12_2_ = auVar112._14_2_;
  auVar268._0_12_ = auVar263;
  auVar268._14_2_ = auVar142._14_2_;
  uVar285 = CONCAT22(sVar127,auVar289._8_2_);
  auVar286._0_8_ = CONCAT26(uVar72,CONCAT24(auVar289._10_2_,uVar285));
  auVar286._8_2_ = auVar289._12_2_;
  auVar286._10_2_ = sVar178;
  auVar290._12_2_ = auVar289._14_2_;
  auVar290._0_12_ = auVar286;
  auVar290._14_2_ = uVar80;
  auVar168._8_4_ = (int)((ulong)auVar227._0_8_ >> 0x20);
  auVar168._0_8_ = auVar227._0_8_;
  auVar168._12_4_ = (int)((ulong)auVar249._0_8_ >> 0x20);
  auVar185._8_4_ = (int)((ulong)auVar263._0_8_ >> 0x20);
  auVar185._0_8_ = auVar263._0_8_;
  auVar185._12_4_ = (int)((ulong)auVar286._0_8_ >> 0x20);
  *(ulong *)(s + -4) = CONCAT44(CONCAT22(auVar161._0_2_,auVar111._0_2_),auVar114._0_4_);
  *(ulong *)s = CONCAT44(CONCAT22(sVar283,auVar289._0_2_),auVar164._0_4_);
  *(long *)(s + (long)p + -4) = auVar130._8_8_;
  *(long *)(s + (long)p + -4 + 4) = auVar192._8_8_;
  puVar1 = s + (long)(p * 2) + -4;
  *(int *)puVar1 = auVar115._8_4_;
  *(int *)(puVar1 + 2) = auVar145._8_4_;
  *(int *)(puVar1 + 4) = auVar165._8_4_;
  *(int *)(puVar1 + 6) = auVar182._8_4_;
  *(undefined4 *)(s + lVar107) = auVar116._12_4_;
  *(undefined4 *)(s + lVar107 + 2) = auVar146._12_4_;
  *(undefined4 *)(s + lVar107 + 4) = auVar166._12_4_;
  *(undefined4 *)(s + lVar107 + 6) = auVar183._12_4_;
  *(ulong *)(s + (long)(p * 4) + -4) = CONCAT44(uVar248,uVar139);
  *(ulong *)(s + (long)(p * 4) + -4 + 4) = CONCAT44(uVar285,uVar262);
  *(long *)(s + (long)(p * 5) + -4) = auVar168._8_8_;
  *(long *)(s + (long)(p * 5) + -4 + 4) = auVar185._8_8_;
  puVar1 = s + (long)(p * 6) + -4;
  *(int *)puVar1 = auVar227._8_4_;
  *(int *)(puVar1 + 2) = auVar249._8_4_;
  *(int *)(puVar1 + 4) = auVar263._8_4_;
  *(int *)(puVar1 + 6) = auVar286._8_4_;
  *(int *)(s + lVar108) = auVar231._12_4_;
  *(int *)(s + lVar108 + 2) = auVar258._12_4_;
  *(int *)(s + lVar108 + 4) = auVar268._12_4_;
  *(int *)(s + lVar108 + 6) = auVar290._12_4_;
  return;
}

Assistant:

void aom_highbd_lpf_vertical_8_dual_sse2(
    uint16_t *s, int p, const uint8_t *blimit0, const uint8_t *limit0,
    const uint8_t *thresh0, const uint8_t *blimit1, const uint8_t *limit1,
    const uint8_t *thresh1, int bd) {
  __m128i x0, x1, x2, x3, x4, x5, x6, x7;
  __m128i d0, d1, d2, d3, d4, d5, d6, d7;

  x0 = _mm_loadu_si128((__m128i *)(s - 4 + 0 * p));
  x1 = _mm_loadu_si128((__m128i *)(s - 4 + 1 * p));
  x2 = _mm_loadu_si128((__m128i *)(s - 4 + 2 * p));
  x3 = _mm_loadu_si128((__m128i *)(s - 4 + 3 * p));
  x4 = _mm_loadu_si128((__m128i *)(s - 4 + 4 * p));
  x5 = _mm_loadu_si128((__m128i *)(s - 4 + 5 * p));
  x6 = _mm_loadu_si128((__m128i *)(s - 4 + 6 * p));
  x7 = _mm_loadu_si128((__m128i *)(s - 4 + 7 * p));

  highbd_transpose8x8_sse2(&x0, &x1, &x2, &x3, &x4, &x5, &x6, &x7, &d0, &d1,
                           &d2, &d3, &d4, &d5, &d6, &d7);

  highbd_lpf_internal_8_dual_sse2(&d0, &d7, &d1, &d6, &d2, &d5, &d3, &d4,
                                  blimit0, limit0, thresh0, blimit1, limit1,
                                  thresh1, bd);

  highbd_transpose8x8_sse2(&d0, &d1, &d2, &d3, &d4, &d5, &d6, &d7, &x0, &x1,
                           &x2, &x3, &x4, &x5, &x6, &x7);

  _mm_storeu_si128((__m128i *)(s - 4 + 0 * p), x0);
  _mm_storeu_si128((__m128i *)(s - 4 + 1 * p), x1);
  _mm_storeu_si128((__m128i *)(s - 4 + 2 * p), x2);
  _mm_storeu_si128((__m128i *)(s - 4 + 3 * p), x3);
  _mm_storeu_si128((__m128i *)(s - 4 + 4 * p), x4);
  _mm_storeu_si128((__m128i *)(s - 4 + 5 * p), x5);
  _mm_storeu_si128((__m128i *)(s - 4 + 6 * p), x6);
  _mm_storeu_si128((__m128i *)(s - 4 + 7 * p), x7);
}